

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

ssize_t __thiscall
boost::xpressive::detail::
list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::splice(list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *this,int __fdin,__off64_t *__offin,int __fdout,__off64_t *__offout,size_t __len,
        uint __flags)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  __off64_t *p_Var3;
  
  puVar1 = (undefined8 *)CONCAT44(in_register_00000034,__fdin);
  bVar2 = empty((list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)__offin);
  p_Var3 = (__off64_t *)CONCAT71(extraout_var,bVar2);
  if (!bVar2) {
    *(undefined8 *)(*__offin + 8) = *puVar1;
    *(undefined8 *)__offin[1] = *(undefined8 *)*puVar1;
    *(__off64_t *)(*(long *)*puVar1 + 8) = __offin[1];
    *(__off64_t *)*puVar1 = *__offin;
    __offin[1] = (__off64_t)__offin;
    *__offin = (__off64_t)__offin;
    p_Var3 = __offin;
  }
  return (ssize_t)p_Var3;
}

Assistant:

void splice(iterator it, list &x)
        {
            if(x.empty())
                return;

            x._sentry._prev->_next = it._node;
            x._sentry._next->_prev = it._node->_prev;

            it._node->_prev->_next = x._sentry._next;
            it._node->_prev = x._sentry._prev;

            x._sentry._prev = x._sentry._next = &x._sentry;
        }